

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext_api.cc
# Opt level: O1

Args * CreateArgs(Args *__return_storage_ptr__,TrainingArgs args,AutotuneArgs autotuneArgs,
                 char *label,char *pretrainedVectors)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  long *local_50 [2];
  long local_40 [2];
  
  fasttext::Args::Args(__return_storage_ptr__);
  __return_storage_ptr__->lr = args.lr;
  __return_storage_ptr__->lrUpdateRate = args.lrUpdateRate;
  __return_storage_ptr__->dim = args.dim;
  __return_storage_ptr__->ws = args.ws;
  __return_storage_ptr__->epoch = args.epoch;
  __return_storage_ptr__->minCount = args.minCount;
  __return_storage_ptr__->minCountLabel = args.minCountLabel;
  __return_storage_ptr__->neg = args.neg;
  __return_storage_ptr__->wordNgrams = args.wordNgrams;
  __return_storage_ptr__->loss = args.loss;
  __return_storage_ptr__->model = args.model;
  __return_storage_ptr__->bucket = args.bucket;
  __return_storage_ptr__->minn = args.minn;
  __return_storage_ptr__->maxn = args.maxn;
  __return_storage_ptr__->thread = args.thread;
  __return_storage_ptr__->t = args.t;
  if (label != (char *)0x0) {
    local_50[0] = local_40;
    sVar2 = strlen(label);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,label,label + sVar2);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->label,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  __return_storage_ptr__->verbose = args.verbose;
  if (pretrainedVectors != (char *)0x0) {
    local_50[0] = local_40;
    sVar2 = strlen(pretrainedVectors);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,pretrainedVectors,pretrainedVectors + sVar2);
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->pretrainedVectors,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  __return_storage_ptr__->saveOutput = args.saveOutput;
  __return_storage_ptr__->seed = args.seed;
  __return_storage_ptr__->qout = args.qout;
  __return_storage_ptr__->retrain = args.retrain;
  __return_storage_ptr__->qnorm = args.qnorm;
  __return_storage_ptr__->cutoff = args.cutoff;
  __return_storage_ptr__->dsub = args.dsub;
  if (autotuneArgs.validationFile == (char *)0x0) {
    autotuneArgs.validationFile = "";
  }
  pcVar3 = (char *)(__return_storage_ptr__->autotuneValidationFile)._M_string_length;
  strlen(autotuneArgs.validationFile);
  std::__cxx11::string::_M_replace
            ((ulong)&__return_storage_ptr__->autotuneValidationFile,0,pcVar3,
             (ulong)autotuneArgs.validationFile);
  __return_storage_ptr__->autotuneDuration = autotuneArgs.duration;
  pcVar3 = "f1";
  if (autotuneArgs.metric != (char *)0x0) {
    pcVar3 = autotuneArgs.metric;
  }
  pcVar1 = (char *)(__return_storage_ptr__->autotuneMetric)._M_string_length;
  strlen(pcVar3);
  std::__cxx11::string::_M_replace
            ((ulong)&__return_storage_ptr__->autotuneMetric,0,pcVar1,(ulong)pcVar3);
  pcVar3 = "";
  if (autotuneArgs.modelSize != (char *)0x0) {
    pcVar3 = autotuneArgs.modelSize;
  }
  pcVar1 = (char *)(__return_storage_ptr__->autotuneModelSize)._M_string_length;
  strlen(pcVar3);
  std::__cxx11::string::_M_replace
            ((ulong)&__return_storage_ptr__->autotuneModelSize,0,pcVar1,(ulong)pcVar3);
  __return_storage_ptr__->autotunePredictions = autotuneArgs.predictions;
  __return_storage_ptr__->autotuneVerbose = autotuneArgs.verbose;
  return __return_storage_ptr__;
}

Assistant:

fasttext::Args CreateArgs(TrainingArgs args, AutotuneArgs autotuneArgs, const char* label, const char* pretrainedVectors)
{
    auto result = fasttext::Args();

    result.lr = args.lr;
    result.lrUpdateRate = args.lrUpdateRate;
    result.dim = args.dim;
    result.ws = args.ws;
    result.epoch = args.epoch;
    result.minCount = args.minCount;
    result.minCountLabel = args.minCountLabel;
    result.neg = args.neg;
    result.wordNgrams = args.wordNgrams;
    result.loss = args.loss;
    result.model = args.model;
    result.bucket = args.bucket;
    result.minn = args.minn;
    result.maxn = args.maxn;
    result.thread = args.thread;
    result.t = args.t;

    if (label != nullptr)
    {
        result.label = std::string(label);
    }

    result.verbose = args.verbose;

    if (pretrainedVectors != nullptr)
    {
        result.pretrainedVectors = std::string(pretrainedVectors);
    }

    result.saveOutput = args.saveOutput;
    result.seed = args.seed;

    result.qout = args.qout;
    result.retrain = args.retrain;
    result.qnorm = args.qnorm;
    result.cutoff = args.cutoff;
    result.dsub = args.dsub;

    // Autotune
    result.autotuneValidationFile = autotuneArgs.validationFile == nullptr ? "" : autotuneArgs.validationFile;
    result.autotuneDuration = autotuneArgs.duration;
    result.autotuneMetric = autotuneArgs.metric == nullptr ? "f1" : autotuneArgs.metric;
    result.autotuneModelSize = autotuneArgs.modelSize == nullptr ? "" : autotuneArgs.modelSize;
    result.autotunePredictions = autotuneArgs.predictions;
    result.autotuneVerbose = autotuneArgs.verbose;

    return result;
}